

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

bool __thiscall
TreePropagator::reachable
          (TreePropagator *this,int node,vector<bool,_std::allocator<bool>_> *blue,bool doDFS)

{
  bool bVar1;
  int iVar2;
  vector<bool,_std::allocator<bool>_> *visited;
  byte in_CL;
  long in_RDI;
  iterator it_1;
  vec<Lit> ps_1;
  vector<bool,_std::allocator<bool>_> pink_1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> badEdges_1;
  Clause *r;
  Clause *expl;
  iterator it;
  vec<Lit> ps;
  vector<bool,_std::allocator<bool>_> pink;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> badEdges;
  int i;
  int count;
  BoolView *in_stack_fffffffffffffd58;
  GraphPropagator *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  Lit in_stack_fffffffffffffd6c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  Lit in_stack_fffffffffffffd7c;
  undefined1 learnt;
  BoolView *in_stack_fffffffffffffd80;
  byte local_261;
  int *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdb8;
  int iVar3;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffdd8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  bool local_205;
  Reason local_1e8;
  int local_1dc;
  _Node_iterator_base<int,_false> local_1d8;
  _Node_iterator_base<int,_false> local_1d0;
  _Node_iterator_base<int,_false> local_1c8;
  int local_1bc;
  vec<Lit> local_1b8;
  undefined1 local_1a1;
  GraphPropagator *local_140;
  reference local_138;
  Clause *local_128;
  int local_120;
  int local_11c;
  _Node_iterator_base<int,_false> local_118;
  _Node_iterator_base<int,_false> local_110;
  _Node_iterator_base<int,_false> local_108;
  int local_fc;
  vec<Lit> local_f8;
  undefined1 local_e2;
  undefined1 local_e1;
  reference local_80;
  int local_6c;
  undefined4 local_68;
  undefined1 local_51;
  byte local_21;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_21 = in_CL & 1;
  if (local_21 != 0) {
    GraphPropagator::nbNodes((GraphPropagator *)0x1e4a44);
    local_51 = 0;
    std::allocator<bool>::allocator((allocator<bool> *)0x1e4a6b);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c.x,in_stack_fffffffffffffd78),
               (bool *)in_stack_fffffffffffffd70._pt,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd70._pt,
               (vector<bool,_std::allocator<bool>_> *)
               CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1e4ab4);
    std::allocator<bool>::~allocator((allocator<bool> *)0x1e4ac1);
    local_68 = 0;
    DFSBlue((TreePropagator *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),iVar3,
            (vector<bool,_std::allocator<bool>_> *)
            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8)
    ;
  }
  local_6c = 0;
  while( true ) {
    iVar3 = local_6c;
    iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x1e4b3e);
    if (iVar2 <= iVar3) {
      return true;
    }
    local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd80,
                          CONCAT44(in_stack_fffffffffffffd7c.x,in_stack_fffffffffffffd78));
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
    local_205 = false;
    if (!bVar1) {
      GraphPropagator::getNodeVar
                (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x1e4bb0);
      local_205 = false;
      if (bVar1) {
        GraphPropagator::getNodeVar
                  (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        local_205 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffd60);
      }
    }
    if (local_205 != false) break;
    local_138 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd80,
                           CONCAT44(in_stack_fffffffffffffd7c.x,in_stack_fffffffffffffd78));
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_138);
    local_261 = 0;
    if (!bVar1) {
      GraphPropagator::getNodeVar
                (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x1e4fdf);
      local_261 = bVar1 ^ 0xff;
    }
    if ((local_261 & 1) != 0) {
      local_140 = (GraphPropagator *)0x0;
      if ((so.lazy & 1U) != 0) {
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
        unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)0x1e501c);
        GraphPropagator::nbNodes((GraphPropagator *)0x1e5029);
        local_1a1 = 0;
        std::allocator<bool>::allocator((allocator<bool> *)0x1e5054);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd80,
                   CONCAT44(in_stack_fffffffffffffd7c.x,in_stack_fffffffffffffd78),
                   (bool *)in_stack_fffffffffffffd70._pt,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68)
                  );
        std::allocator<bool>::~allocator((allocator<bool> *)0x1e5082);
        DFSPink((TreePropagator *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0,
                in_stack_fffffffffffffdd8,
                (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        vec<Lit>::vec(&local_1b8);
        vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd60);
        in_stack_fffffffffffffd80 =
             GraphPropagator::getNodeVar
                       (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        in_stack_fffffffffffffd7c = BoolView::getValLit(in_stack_fffffffffffffd58);
        local_1bc = in_stack_fffffffffffffd7c.x;
        vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd70._pt,
                       (Lit *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
        std::__detail::_Node_iterator<int,_true,_false>::_Node_iterator
                  ((_Node_iterator<int,_true,_false> *)0x1e5128);
        local_1d0._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   in_stack_fffffffffffffd58);
        local_1c8._M_cur = local_1d0._M_cur;
        while( true ) {
          local_1d8._M_cur =
               (__node_type *)
               std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   in_stack_fffffffffffffd58);
          bVar1 = std::__detail::operator!=(&local_1c8,&local_1d8);
          if (!bVar1) break;
          std::__detail::_Node_iterator<int,_true,_false>::operator*
                    ((_Node_iterator<int,_true,_false> *)0x1e518f);
          in_stack_fffffffffffffd70._pt =
               (Clause *)
               GraphPropagator::getEdgeVar
                         (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20))
          ;
          in_stack_fffffffffffffd6c = BoolView::getValLit(in_stack_fffffffffffffd58);
          local_1dc = in_stack_fffffffffffffd6c.x;
          vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd70._pt,
                         (Lit *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
          std::__detail::_Node_iterator<int,_true,_false>::operator++
                    ((_Node_iterator<int,_true,_false> *)in_stack_fffffffffffffd60);
        }
        in_stack_fffffffffffffd60 =
             (GraphPropagator *)Reason_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffd60);
        local_140 = in_stack_fffffffffffffd60;
        vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffd60);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x1e529e);
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
        ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)0x1e52ab);
      }
      in_stack_fffffffffffffd58 =
           GraphPropagator::getNodeVar
                     (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      Reason::Reason(&local_1e8,(Clause *)local_140);
      BoolView::setVal2((BoolView *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68),
                        SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0),
                        (Reason)in_stack_fffffffffffffd70);
      std::vector<Tint,_std::allocator<Tint>_>::operator[]
                ((vector<Tint,_std::allocator<Tint>_> *)(in_RDI + 0x170),(long)local_6c);
      Tint::operator=((Tint *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c.x);
    }
    local_6c = local_6c + 1;
  }
  if ((so.lazy & 1U) != 0) {
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               0x1e4c13);
    iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x1e4c20);
    visited = (vector<bool,_std::allocator<bool>_> *)(long)iVar2;
    local_e1 = 0;
    iVar3 = (int)((ulong)&local_e2 >> 0x20);
    std::allocator<bool>::allocator((allocator<bool> *)0x1e4c57);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c.x,in_stack_fffffffffffffd78),
               (bool *)in_stack_fffffffffffffd70._pt,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    std::allocator<bool>::~allocator((allocator<bool> *)0x1e4c8b);
    DFSPink((TreePropagator *)CONCAT44(iVar2,in_stack_fffffffffffffdf0),iVar3,visited,
            in_stack_fffffffffffffdd8,
            (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    vec<Lit>::vec(&local_f8);
    GraphPropagator::getNodeVar
              (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    local_fc = (int)BoolView::getValLit(in_stack_fffffffffffffd58);
    vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd70._pt,
                   (Lit *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    std::__detail::_Node_iterator<int,_true,_false>::_Node_iterator
              ((_Node_iterator<int,_true,_false> *)0x1e4d28);
    local_110._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    in_stack_fffffffffffffd58);
    local_108._M_cur = local_110._M_cur;
    while( true ) {
      local_118._M_cur =
           (__node_type *)
           std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                     ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)in_stack_fffffffffffffd58);
      bVar1 = std::__detail::operator!=(&local_108,&local_118);
      learnt = (undefined1)((uint)in_stack_fffffffffffffd7c.x >> 0x18);
      if (!bVar1) break;
      std::__detail::_Node_iterator<int,_true,_false>::operator*
                ((_Node_iterator<int,_true,_false> *)0x1e4d8f);
      GraphPropagator::getEdgeVar
                (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      local_11c = (int)BoolView::getValLit(in_stack_fffffffffffffd58);
      vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd70._pt,
                     (Lit *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
      std::__detail::_Node_iterator<int,_true,_false>::operator++
                ((_Node_iterator<int,_true,_false> *)in_stack_fffffffffffffd60);
    }
    GraphPropagator::getNodeVar
              (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    local_120 = (int)BoolView::getValLit(in_stack_fffffffffffffd58);
    vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffd70._pt,
                   (Lit *)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    local_128 = ::Clause_new<vec<Lit>>((vec<Lit> *)in_stack_fffffffffffffd80,(bool)learnt);
    *(uint *)local_128 = *(uint *)local_128 | 2;
    vec<vec<Clause_*>_>::last(&sat.rtrail);
    vec<Clause_*>::push((vec<Clause_*> *)in_stack_fffffffffffffd70._pt,
                        (Clause **)CONCAT44(in_stack_fffffffffffffd6c.x,in_stack_fffffffffffffd68));
    sat.confl = local_128;
    vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffd60);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1e4f46);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   0x1e4f53);
  }
  return false;
}

Assistant:

bool TreePropagator::reachable(int node, std::vector<bool>& blue, bool doDFS) {
	if (doDFS) {
		blue = std::vector<bool>(nbNodes(), false);
		int count = 0;
		DFSBlue(node, blue, count);
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (blue[i] == false && getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] /\ any-fixed-not-visited => fail

				vec<Lit> ps;
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				assert(getNodeVar(i).isFixed());
				ps.push(getNodeVar(i).getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (blue[i] == false && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] => unfixed-not-visited = false

				vec<Lit> ps;
				ps.push();
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				r = Reason_new(ps);
			}
			// cout << "REACHABLE (N) "<<i<<endl;
			getNodeVar(i).setVal2(false, r);
			last_state_n[i] = VT_OUT;
		}
	}
	return true;
}